

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void * __thiscall CASC_ARRAY::InsertAt(CASC_ARRAY *this,size_t ItemIndex)

{
  void *pvVar1;
  ulong uVar2;
  size_t NewItemCount;
  
  uVar2 = this->m_ItemCount;
  NewItemCount = ItemIndex - uVar2;
  if (uVar2 <= ItemIndex && NewItemCount != 0) {
    pvVar1 = Insert(this,(void *)0x0,NewItemCount);
    if (pvVar1 == (void *)0x0) {
      return (void *)0x0;
    }
    memset(pvVar1,0,NewItemCount * this->m_ItemSize);
    uVar2 = this->m_ItemCount;
  }
  if (uVar2 == ItemIndex) {
    Insert(this,(void *)0x0,1);
  }
  pvVar1 = ItemAt(this,ItemIndex);
  return pvVar1;
}

Assistant:

void * InsertAt(size_t ItemIndex)
    {
        void * pNewItem;
        size_t AddedItemCount;

        // Is there enough items?
        if (ItemIndex > m_ItemCount)
        {
            // Capture the new item count
            AddedItemCount = ItemIndex - m_ItemCount;

            // Insert the amount of items
            pNewItem = Insert(NULL, AddedItemCount);
            if (pNewItem == NULL)
                return NULL;

            // Zero the inserted items
            memset(pNewItem, 0, m_ItemSize * AddedItemCount);
        }

        // Is the item already inserted?
        if (ItemIndex == m_ItemCount)
        {
            Insert(NULL, 1);
        }

        // Return the item at a given index
        return ItemAt(ItemIndex);
    }